

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

void gpio_write(uint32_t address,uint16_t value)

{
  uint uVar1;
  ushort in_SI;
  uint in_EDI;
  uint8_t unaff_retaddr;
  gpio_port_t unaff_retaddr_00;
  gpio_port_t port;
  
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] [GPIO] gpio write 0x%04X to address 0x%08X\n",(ulong)in_SI,(ulong)in_EDI);
  }
  uVar1 = in_EDI & 0xf;
  if (uVar1 == 4) {
    if (bus->gpio_device != RTC) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/gpio.c",
              0x2b);
      fprintf(_stderr,"Write to data port for unimplemented device %d\n\x1b[0;m",
              (ulong)bus->gpio_device);
      exit(1);
    }
    gba_rtc_write(unaff_retaddr_00,unaff_retaddr);
  }
  else if (uVar1 == 6) {
    bus->gpio_write_mask = (byte)in_SI & 0xf;
    bus->gpio_read_mask = ((byte)in_SI ^ 0xff) & 0xf;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] [GPIO] Set the read mask to 0x%X and the write mask to 0x%X\n",
             (ulong)bus->gpio_read_mask,(ulong)bus->gpio_write_mask);
    }
  }
  else if (uVar1 == 8) {
    bus->allow_gpio_read = (in_SI & 1) == 1;
    if ((bus->allow_gpio_read & 1U) == 0) {
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] [GPIO] GPIO is now UNREADABLE!\n");
      }
    }
    else if (2 < gba_log_verbosity) {
      printf("[DEBUG] [GPIO] GPIO is now READABLE!\n");
    }
  }
  return;
}

Assistant:

void gpio_write(word address, half value) {
    logdebug("[GPIO] gpio write 0x%04X to address 0x%08X", value, address);
    switch (address & 0xF) {
        case 0x4: // Data
            switch (bus->gpio_device) {
                case RTC: {
                    gpio_port_t port;
                    port.raw = value & bus->gpio_write_mask;
                    gba_rtc_write(port, bus->gpio_write_mask);
                    break;
                }
                default:
                    logfatal("Write to data port for unimplemented device %d", bus->gpio_device)
            }
            break;
        case 0x6:
            bus->gpio_write_mask = value    & 0b1111;
            bus->gpio_read_mask  = (~value) & 0b1111;
            logdebug("[GPIO] Set the read mask to 0x%X and the write mask to 0x%X", bus->gpio_read_mask, bus->gpio_write_mask);
            break;
        case 0x8:
            bus->allow_gpio_read = (value & 1) == 1;
            if (bus->allow_gpio_read) {
                logdebug("[GPIO] GPIO is now READABLE!");
            } else {
                logdebug("[GPIO] GPIO is now UNREADABLE!");
            }
            break;
    }
}